

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogSink.cpp
# Opt level: O0

void __thiscall gnilk::LogSink::OnAttached(LogSink *this)

{
  LogManager *this_00;
  anon_class_8_1_8991fb9c local_38;
  CachedEventDelgate local_30;
  LogSink *local_10;
  LogSink *this_local;
  
  local_10 = this;
  this_00 = LogManager::Instance();
  local_38.this = this;
  std::function<bool(gnilk::LogEvent_const&)>::function<gnilk::LogSink::OnAttached()::__0,void>
            ((function<bool(gnilk::LogEvent_const&)> *)&local_30,&local_38);
  LogManager::IterateCache(this_00,&local_30);
  std::function<bool_(const_gnilk::LogEvent_&)>::~function(&local_30);
  return;
}

Assistant:

void LogSink::OnAttached() {
    LogManager::Instance().IterateCache([this](const LogEvent &event) -> bool {
        if (WithinRange(event.Level())) {
            if (Write(event) < 0) {
                return false;
            }
        }
        return true;
    });
}